

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

void split_node(dtree_t *tr,uint32 node_id,float32 ****mixw,float32 ****means,float32 ****vars,
               uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
               float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
               uint32 n_dfeat,float32 mwfloor)

{
  dtree_node_t *pdVar1;
  uint uVar2;
  dtree_node_t *pdVar3;
  uint32 *puVar4;
  int iVar5;
  uint32 *id;
  uint32 *id_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 in_stack_ffffffffffffff58;
  quest_t *pqVar10;
  uint local_74;
  
  pdVar3 = tr->node;
  pdVar1 = pdVar3 + node_id;
  puVar4 = pdVar3[node_id].id;
  uVar2 = pdVar3[node_id].n_id;
  uVar6 = 0;
  uVar7 = 0;
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    iVar5 = eval_quest((quest_t *)pdVar1->q,dfeat[puVar4[uVar9]],n_dfeat);
    uVar6 = uVar6 + (iVar5 == 0);
    uVar7 = uVar7 + (iVar5 != 0);
  }
  id = (uint32 *)
       __ckd_calloc__((ulong)uVar7,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x480);
  id_00 = (uint32 *)
          __ckd_calloc__((ulong)uVar6,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x481);
  local_74 = 0;
  uVar8 = 0;
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    uVar6 = puVar4[uVar9];
    iVar5 = eval_quest((quest_t *)pdVar1->q,dfeat[uVar6],n_dfeat);
    if (iVar5 == 0) {
      id_00[local_74] = uVar6;
      local_74 = local_74 + 1;
    }
    else {
      id[uVar8] = uVar6;
      uVar8 = (ulong)((uint32)uVar8 + 1);
    }
  }
  uVar2 = tr->n_node;
  uVar6 = uVar2 + 1;
  tr->n_node = uVar2 + 2;
  pdVar3 = tr->node;
  pdVar1->y = pdVar3 + uVar2;
  pdVar1->n = pdVar3 + uVar6;
  pdVar3[uVar2].p = pdVar1;
  pdVar3[uVar6].p = pdVar1;
  mk_node(pdVar3 + uVar2,uVar2,id,(uint32)uVar8,mixw,means,vars,veclen,
          (uint32)in_stack_ffffffffffffff58,n_state,n_stream,n_density,stwt,mwfloor);
  pqVar10 = all_q;
  set_best_quest(pdVar1->y,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  mk_node(pdVar1->n,uVar6,id_00,local_74,mixw,means,vars,veclen,(uint32)pqVar10,n_state,n_stream,
          n_density,stwt,mwfloor);
  set_best_quest(pdVar1->n,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  return;
}

Assistant:

void
split_node(dtree_t *tr,
	   uint32 node_id,
	   float32 ****mixw,
           float32 ****means,
           float32 ****vars,
           uint32 *veclen,
	   uint32 n_model,
	   uint32 n_state,
	   uint32 n_stream,
	   uint32 n_density,
	   float32 *stwt,

	   quest_t *all_q,
	   uint32 n_all_q,
	   pset_t *pset,
	   
	   uint32 **dfeat,
	   uint32 n_dfeat,

	   float32 mwfloor)
{
    uint32 *id, n_id;
    uint32 *id_yes, n_yes;
    uint32 *id_no, n_no;
    dtree_node_t *node;
    uint32 node_id_yes;
    uint32 node_id_no;
    uint32 ii, i;

    node = &tr->node[node_id];

    id = node->id;
    n_id = node->n_id;

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    ++n_yes;
	}
	else {
	    ++n_no;
	}
    }

#if 0
    fprintf(stderr, "Split: (");
    print_quest(stderr, pset, (quest_t *)node->q);
    fprintf(stderr, ") %u/%u %.3e\n", n_yes, n_no, node->wt_ent_dec);
#endif

    id_yes = ckd_calloc(n_yes, sizeof(uint32));
    id_no = ckd_calloc(n_no, sizeof(uint32));

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    id_yes[n_yes] = i;
	    ++n_yes;
	}
	else {
	    id_no[n_no] = i;
	    ++n_no;
	}
    }

    node_id_yes = tr->n_node++;
    node_id_no = tr->n_node++;

    node->y = &tr->node[node_id_yes];
    node->n = &tr->node[node_id_no];
    node->y->p = node;
    node->n->p = node;

    mk_node(node->y,
	    node_id_yes,
	    id_yes, n_yes,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->y,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);

    mk_node(node->n,
	    node_id_no,
	    id_no, n_no,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->n,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);
}